

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t expectedUnits;
  string *psVar1;
  bool bVar2;
  WeightParamType WVar3;
  BatchnormLayerParams *pBVar4;
  WeightParams *pWVar5;
  bool bVar6;
  allocator local_e2;
  allocator local_e1;
  string local_e0;
  string err;
  Result r;
  string local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar2 = Result::good(&r);
  if (bVar2) {
    if (this->ndArrayInterpretation != true) {
LAB_00246126:
      pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
      pWVar5 = pBVar4->gamma_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar3 = valueType(pWVar5);
      if (WVar3 == FLOAT32) {
LAB_002461ae:
        bVar2 = false;
      }
      else {
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->beta_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 == FLOAT32) goto LAB_002461ae;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->mean_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 == FLOAT32) goto LAB_002461ae;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->variance_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        bVar2 = WVar3 != FLOAT32;
      }
      pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
      pWVar5 = pBVar4->gamma_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar3 = valueType(pWVar5);
      if (WVar3 == FLOAT16) {
LAB_0024621a:
        bVar6 = false;
      }
      else {
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->beta_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 == FLOAT16) goto LAB_0024621a;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->mean_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 == FLOAT16) goto LAB_0024621a;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->variance_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        bVar6 = WVar3 != FLOAT16;
      }
      pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
      pWVar5 = pBVar4->gamma_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar3 = valueType(pWVar5);
      if (WVar3 == UNSPECIFIED) {
LAB_00246283:
        std::operator+(&local_e0,"Batchnorm layer \'",(layer->name_).ptr_);
        std::operator+(&err,&local_e0,
                       "\' parameters have values for both full and half precision. Parameters should either be specified in half or full precision, mixed parameters are not supported."
                      );
        std::__cxx11::string::~string((string *)&local_e0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else {
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->beta_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 == UNSPECIFIED) goto LAB_00246283;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->mean_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 == UNSPECIFIED) goto LAB_00246283;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->variance_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if ((WVar3 == UNSPECIFIED) || (!bVar2 && !bVar6)) goto LAB_00246283;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        expectedUnits = pBVar4->channels_;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->gamma_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        std::__cxx11::string::string((string *)&local_e0,"BatchNorm",&local_e1);
        psVar1 = (layer->name_).ptr_;
        std::__cxx11::string::string((string *)&local_70,"gamma",&local_e2);
        validateGeneralWeightParams
                  ((Result *)&err,pWVar5,expectedUnits,1,&local_e0,psVar1,&local_70);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e0);
        bVar2 = Result::good(&r);
        if (!bVar2) goto LAB_002464a5;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->beta_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        std::__cxx11::string::string((string *)&local_e0,"BatchNorm",&local_e1);
        psVar1 = (layer->name_).ptr_;
        std::__cxx11::string::string((string *)&local_70,"beta",&local_e2);
        validateGeneralWeightParams
                  ((Result *)&err,pWVar5,expectedUnits,1,&local_e0,psVar1,&local_70);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e0);
        bVar2 = Result::good(&r);
        if (!bVar2) goto LAB_002464a5;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        if (pBVar4->computemeanvar_ != false) goto LAB_002464a5;
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->mean_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if (WVar3 != EMPTY) {
          pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
          pWVar5 = pBVar4->mean_;
          if (pWVar5 == (WeightParams *)0x0) {
            pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar3 = valueType(pWVar5);
          if (WVar3 != EMPTY) {
            pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
            pWVar5 = pBVar4->mean_;
            if (pWVar5 == (WeightParams *)0x0) {
              pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&local_e0,"BatchNorm",&local_e1);
            psVar1 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_70,"mean",&local_e2);
            validateGeneralWeightParams
                      ((Result *)&err,pWVar5,expectedUnits,1,&local_e0,psVar1,&local_70);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_e0);
            bVar2 = Result::good(&r);
            if (bVar2) {
              pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
              pWVar5 = pBVar4->variance_;
              if (pWVar5 == (WeightParams *)0x0) {
                pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string((string *)&local_e0,"BatchNorm",&local_e1);
              psVar1 = (layer->name_).ptr_;
              std::__cxx11::string::string((string *)&local_70,"variance",&local_e2);
              validateGeneralWeightParams
                        ((Result *)&err,pWVar5,expectedUnits,1,&local_e0,psVar1,&local_70);
              Result::operator=(&r,(Result *)&err);
              std::__cxx11::string::~string((string *)&err._M_string_length);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_e0);
              Result::good(&r);
            }
            goto LAB_002464a5;
          }
        }
        std::operator+(&local_e0,"Batchnorm layer \'",(layer->name_).ptr_);
        std::operator+(&err,&local_e0,"\' is missing mean and variance.");
        std::__cxx11::string::~string((string *)&local_e0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      std::__cxx11::string::~string((string *)&err);
      goto LAB_002464b2;
    }
    std::__cxx11::string::string((string *)&local_50,"Batchnorm",(allocator *)&local_e0);
    validateInputOutputRankEquality((Result *)&err,layer,&local_50,&this->blobNameToRank);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = Result::good(&r);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_e0,"Batchnorm",(allocator *)&local_70);
      validateRankCount((Result *)&err,layer,&local_e0,3,-1,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_e0);
      bVar2 = Result::good(&r);
      if (bVar2) goto LAB_00246126;
    }
  }
LAB_002464a5:
  Result::Result(__return_storage_ptr__,&r);
LAB_002464b2:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    r = validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta");
    if (!r.good()) return r;
    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        r = validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance");
        if (!r.good()) return r;
    }
    return r;
}